

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_check.c
# Opt level: O1

_Bool ch_checkstring(ch_context *vm,ch_primitive value,ch_string **actual)

{
  _Bool _Var1;
  
  if (value.type == PRIMITIVE_OBJECT) {
    if (((ch_object *)&(value.field_1.object_value)->type)->type == TYPE_STRING) {
      *actual = (ch_string *)value.field_1;
      _Var1 = true;
    }
    else {
      _Var1 = false;
      ch_runtime_error(vm,EXIT_USER_ERROR,"Expected string type, but got object type %d instead");
    }
  }
  else {
    ch_runtime_error(vm,EXIT_USER_ERROR,"Expected string type, but got type %d instead",
                     value._0_8_ & 0xffffffff);
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool ch_checkstring(ch_context* vm, ch_primitive value, ch_string** actual) {
	ch_object* object_value = NULL;
	if(!checkobject(vm, value, &object_value)) return false;

	if (!IS_STRING(object_value)) {
		ch_runtime_error(vm, EXIT_USER_ERROR, "Expected string type, but got object type %d instead", object_value->type);
		return false;
	}

	*actual = AS_STRING(object_value);

	return true;
}